

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O1

void __thiscall
Projection::computeRhoG
          (Projection *this,FArrayBox *rhoFab,FArrayBox *phiFab,Geometry *geom,Orientation *outFaces
          ,int numOutFlowFaces,Real gravity)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  BCRec *pBVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  bool bVar19;
  int *lbc;
  bool bVar20;
  double *pdVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  double *pdVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  double *pdVar33;
  double *pdVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  int i;
  long lVar43;
  ulong uVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  double dVar53;
  ulong in_XMM0_Qb;
  double dVar54;
  int hi_bc [3];
  int lo_bc [3];
  int local_60 [6];
  Real local_48;
  ulong uStack_40;
  
  if (0 < numOutFlowFaces) {
    dVar53 = -gravity;
    uStack_40 = in_XMM0_Qb ^ 0x8000000000000000;
    uVar44 = 0;
    local_48 = dVar53;
    do {
      iVar2 = outFaces[uVar44].val;
      if (iVar2 % 3 == 2) {
        if (2 < iVar2 - 3U) {
          amrex::Abort_host(
                           "Projection::computeRhoG : Simulation box has outflow boundary condition on the bottom and gravity != 0. If this is really the desired configuration, just comment out this Abort"
                           );
          dVar53 = local_48;
        }
      }
      else {
        iVar3 = phiFab[uVar44].super_BaseFab<double>.domain.smallend.vect[0];
        lVar31 = (long)iVar3;
        iVar4 = phiFab[uVar44].super_BaseFab<double>.domain.smallend.vect[1];
        lVar35 = (long)iVar4;
        iVar5 = phiFab[uVar44].super_BaseFab<double>.domain.smallend.vect[2];
        lVar12 = (long)iVar5;
        iVar28 = phiFab[uVar44].super_BaseFab<double>.domain.bigend.vect[0];
        lVar24 = (long)iVar28;
        iVar30 = phiFab[uVar44].super_BaseFab<double>.domain.bigend.vect[1];
        lVar37 = (long)iVar30;
        iVar6 = phiFab[uVar44].super_BaseFab<double>.domain.bigend.vect[2];
        lVar40 = (long)iVar6;
        pdVar21 = phiFab[uVar44].super_BaseFab<double>.dptr;
        lVar25 = (long)((iVar30 - iVar4) + 1);
        pdVar17 = rhoFab[uVar44].super_BaseFab<double>.dptr;
        uVar7 = rhoFab[uVar44].super_BaseFab<double>.domain.smallend.vect[0];
        lVar36 = (long)(int)uVar7;
        uVar8 = rhoFab[uVar44].super_BaseFab<double>.domain.smallend.vect[1];
        lVar38 = (long)(int)uVar8;
        lVar32 = (long)rhoFab[uVar44].super_BaseFab<double>.domain.smallend.vect[2];
        iVar13 = rhoFab[uVar44].super_BaseFab<double>.domain.bigend.vect[0];
        lVar15 = (long)(int)((rhoFab[uVar44].super_BaseFab<double>.domain.bigend.vect[1] - uVar8) +
                            1);
        dVar1 = (geom->super_CoordSys).dx[2];
        iVar23 = (geom->domain).smallend.vect[0];
        iVar14 = (geom->domain).smallend.vect[1];
        iVar9 = (geom->domain).bigend.vect[0];
        iVar10 = (geom->domain).bigend.vect[1];
        pBVar11 = this->phys_bc;
        lVar43 = 0;
        do {
          local_60[lVar43 + 3] = scalar_bc[pBVar11->bc[lVar43]];
          local_60[lVar43] = scalar_bc[pBVar11->bc[lVar43 + 3]];
          lVar43 = lVar43 + 1;
        } while (lVar43 != 3);
        lVar43 = (long)((iVar28 - iVar3) + 1);
        lVar18 = (long)(int)((iVar13 - uVar7) + 1);
        if (iVar2 % 3 == 0) {
          bVar19 = iVar4 == iVar14;
          bVar45 = local_60[4] == 3;
          bVar46 = iVar10 + 1 == iVar30;
          bVar47 = local_60[1] == 3;
          bVar48 = local_60[4] == 4;
          bVar49 = local_60[1] == 4;
          bVar50 = local_60[4] == 2;
          bVar51 = local_60[1] == 2;
          iVar13 = iVar4 + 1;
          iVar28 = iVar4;
          if (bVar19 && ((bVar45 || bVar48) || bVar50)) {
            iVar28 = iVar13;
          }
          iVar14 = iVar30 + -1;
          iVar23 = iVar30;
          if (bVar46 && ((bVar47 || bVar49) || bVar51)) {
            iVar23 = iVar14;
          }
          if (iVar2 + 2U < 5) {
            if (iVar28 <= iVar23) {
              lVar26 = (long)(int)((iVar3 - uVar7) + 1);
              lVar39 = (long)iVar28;
              lVar24 = ((lVar40 + -1) - lVar32) * lVar15;
              iVar28 = ~uVar8 + iVar28;
              lVar22 = (lVar39 * 8 + lVar24 * 8 + lVar38 * -8) * lVar18;
              lVar41 = lVar22 + lVar26 * 8 + (long)pdVar17;
              lVar22 = lVar22 + lVar31 * 8 + lVar36 * -8 + (long)pdVar17;
              pdVar27 = (double *)
                        ((lVar39 * 8 + ((lVar40 + -1) - lVar12) * lVar25 * 8 + lVar35 * -8) * lVar43
                        + (long)pdVar21);
              do {
                if (iVar5 < iVar6) {
                  lVar42 = (lVar24 * 8 + (long)iVar28 * 8) * lVar18;
                  dVar54 = 0.0;
                  lVar29 = 0;
                  lVar16 = lVar40;
                  pdVar33 = pdVar27;
                  do {
                    lVar16 = lVar16 + -1;
                    dVar54 = dVar54 + ((*(double *)(lVar22 + lVar29) +
                                       *(double *)
                                        ((long)pdVar17 + lVar29 + lVar42 + lVar31 * 8 + lVar36 * -8)
                                       ) * 0.5 * 3.0 +
                                      (*(double *)(lVar41 + lVar29) +
                                      *(double *)((long)pdVar17 + lVar29 + lVar42 + lVar26 * 8)) *
                                      -0.5) * 0.5 * dVar53 * dVar1;
                    *pdVar33 = *pdVar33 + dVar54;
                    lVar29 = lVar29 + lVar15 * lVar18 * -8;
                    pdVar33 = pdVar33 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar16);
                }
                lVar39 = lVar39 + 1;
                iVar28 = iVar28 + 1;
                lVar41 = lVar41 + lVar18 * 8;
                lVar22 = lVar22 + lVar18 * 8;
                pdVar27 = pdVar27 + lVar43;
              } while (iVar23 + 1 != (int)lVar39);
            }
            if (bVar19 && ((bVar45 || bVar48) || bVar50)) {
              if (bVar45 && bVar19) {
                if (iVar5 < iVar6) {
                  pdVar33 = (double *)
                            (((long)(int)(~uVar8 + iVar4) * 8 +
                             ((lVar40 + -1) - lVar32) * lVar15 * 8) * lVar18 + (long)pdVar17);
                  pdVar27 = pdVar21 + ((lVar40 + -1) - lVar12) * lVar25 * lVar43;
                  dVar54 = 0.0;
                  lVar24 = lVar40;
                  do {
                    lVar24 = lVar24 + -1;
                    dVar54 = dVar54 + (pdVar33[lVar31 - lVar36] * 3.0 -
                                      pdVar33[(int)((iVar3 - uVar7) + 1)]) * 0.5 * dVar53 * dVar1;
                    *pdVar27 = *pdVar27 + dVar54;
                    pdVar33 = pdVar33 + -(lVar15 * lVar18);
                    pdVar27 = pdVar27 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar24);
                }
              }
              else if (bVar48 && bVar19) {
                if (iVar5 < iVar6) {
                  lVar22 = (long)(int)((iVar3 - uVar7) + 1);
                  lVar24 = ((lVar40 + -1) - lVar32) * lVar15;
                  lVar39 = ((long)iVar13 * 8 + lVar24 * 8 + lVar38 * -8) * lVar18;
                  lVar26 = (lVar35 * 8 + lVar24 * 8 + lVar38 * -8) * lVar18;
                  pdVar33 = pdVar21 + ((lVar40 + -1) - lVar12) * lVar25 * lVar43;
                  dVar54 = 0.0;
                  pdVar27 = pdVar17;
                  lVar24 = lVar40;
                  do {
                    lVar24 = lVar24 + -1;
                    dVar54 = dVar54 + ((*(double *)
                                         ((long)pdVar27 + lVar26 + lVar31 * 8 + lVar36 * -8) * 3.0 -
                                       *(double *)
                                        ((long)pdVar27 + lVar39 + lVar31 * 8 + lVar36 * -8)) * 0.5 *
                                       3.0 + (*(double *)((long)pdVar27 + lVar26 + lVar22 * 8) * 3.0
                                             - *(double *)((long)pdVar27 + lVar39 + lVar22 * 8)) *
                                             -0.5) * 0.5 * dVar53 * dVar1;
                    *pdVar33 = *pdVar33 + dVar54;
                    pdVar27 = pdVar27 + -(lVar15 * lVar18);
                    pdVar33 = pdVar33 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar24);
                }
              }
              else if ((bVar50 && bVar19) && iVar5 < iVar6) {
                pdVar33 = (double *)
                          ((lVar35 * 8 + ((lVar40 + -1) - lVar32) * lVar15 * 8 + lVar38 * -8) *
                           lVar18 + (long)pdVar17);
                pdVar27 = pdVar21 + ((lVar40 + -1) - lVar12) * lVar25 * lVar43;
                dVar54 = 0.0;
                lVar24 = lVar40;
                do {
                  lVar24 = lVar24 + -1;
                  dVar54 = dVar54 + (pdVar33[lVar31 - lVar36] * 3.0 -
                                    pdVar33[(int)((iVar3 - uVar7) + 1)]) * 0.5 * dVar53 * dVar1;
                  *pdVar27 = *pdVar27 + dVar54;
                  pdVar33 = pdVar33 + -(lVar15 * lVar18);
                  pdVar27 = pdVar27 + -(lVar25 * lVar43);
                } while (lVar12 < lVar24);
              }
            }
            if (bVar46 && ((bVar47 || bVar49) || bVar51)) {
              if (bVar47 && bVar46) {
                if (iVar5 < iVar6) {
                  pdVar17 = (double *)
                            ((long)pdVar17 +
                            (lVar37 * 8 + ((lVar40 + -1) - lVar32) * lVar15 * 8 + lVar38 * -8) *
                            lVar18);
                  pdVar21 = (double *)
                            ((long)pdVar21 +
                            (lVar37 * 8 + ((lVar40 + -1) - lVar12) * lVar25 * 8 + lVar35 * -8) *
                            lVar43);
                  dVar54 = 0.0;
                  do {
                    lVar40 = lVar40 + -1;
                    dVar54 = dVar54 + (pdVar17[lVar31 - lVar36] * 3.0 -
                                      pdVar17[(int)((iVar3 - uVar7) + 1)]) * 0.5 * dVar53 * dVar1;
                    *pdVar21 = *pdVar21 + dVar54;
                    pdVar17 = pdVar17 + -(lVar15 * lVar18);
                    pdVar21 = pdVar21 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar40);
                }
              }
              else if (bVar49 && bVar46) {
                if (iVar5 < iVar6) {
                  lVar24 = ((lVar40 + -1) - lVar32) * lVar15;
                  lVar32 = (long)(int)((iVar3 - uVar7) + 1);
                  lVar22 = ((long)(int)((iVar30 - uVar8) + -2) * 8 + lVar24 * 8) * lVar18;
                  lVar24 = ((long)iVar14 * 8 + lVar24 * 8 + lVar38 * -8) * lVar18;
                  pdVar21 = (double *)
                            ((long)pdVar21 +
                            (lVar37 * 8 + ((lVar40 + -1) - lVar12) * lVar25 * 8 + lVar35 * -8) *
                            lVar43);
                  dVar54 = 0.0;
                  do {
                    lVar40 = lVar40 + -1;
                    dVar54 = dVar54 + ((*(double *)
                                         ((long)pdVar17 + lVar24 + lVar31 * 8 + lVar36 * -8) * 3.0 -
                                       *(double *)
                                        ((long)pdVar17 + lVar22 + lVar31 * 8 + lVar36 * -8)) * 0.5 *
                                       3.0 + (*(double *)((long)pdVar17 + lVar24 + lVar32 * 8) * 3.0
                                             - *(double *)((long)pdVar17 + lVar22 + lVar32 * 8)) *
                                             -0.5) * 0.5 * dVar53 * dVar1;
                    *pdVar21 = *pdVar21 + dVar54;
                    pdVar17 = pdVar17 + -(lVar15 * lVar18);
                    pdVar21 = pdVar21 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar40);
                }
              }
              else if ((bVar51 && bVar46) && iVar5 < iVar6) {
                pdVar17 = (double *)
                          ((long)pdVar17 +
                          ((long)iVar14 * 8 + ((lVar40 + -1) - lVar32) * lVar15 * 8 + lVar38 * -8) *
                          lVar18);
                pdVar21 = (double *)
                          ((long)pdVar21 +
                          (lVar37 * 8 + ((lVar40 + -1) - lVar12) * lVar25 * 8 + lVar35 * -8) *
                          lVar43);
                dVar54 = 0.0;
                do {
                  lVar40 = lVar40 + -1;
                  dVar54 = dVar54 + (pdVar17[lVar31 - lVar36] * 3.0 -
                                    pdVar17[(int)((iVar3 - uVar7) + 1)]) * 0.5 * dVar53 * dVar1;
                  *pdVar21 = *pdVar21 + dVar54;
                  pdVar17 = pdVar17 + -(lVar15 * lVar18);
                  pdVar21 = pdVar21 + -(lVar25 * lVar43);
                } while (lVar12 < lVar40);
              }
            }
          }
          else {
            if (iVar28 <= iVar23) {
              lVar36 = (long)(int)((iVar3 - uVar7) + -2);
              lVar26 = (long)iVar28;
              lVar22 = ((lVar40 + -1) - lVar32) * lVar15;
              iVar28 = ~uVar8 + iVar28;
              lVar31 = (lVar26 * 8 + lVar22 * 8 + lVar38 * -8) * lVar18;
              lVar24 = lVar31 + lVar36 * 8;
              lVar31 = lVar31 + (long)(int)(~uVar7 + iVar3) * 8;
              pdVar27 = (double *)
                        ((lVar26 * 8 + ((lVar40 + -1) - lVar12) * lVar25 * 8 + lVar35 * -8) * lVar43
                        + (long)pdVar21);
              do {
                if (iVar5 < iVar6) {
                  lVar41 = (lVar22 * 8 + (long)iVar28 * 8) * lVar18;
                  dVar54 = 0.0;
                  lVar39 = lVar40;
                  pdVar33 = pdVar27;
                  pdVar34 = pdVar17;
                  do {
                    lVar39 = lVar39 + -1;
                    dVar54 = dVar54 + ((*(double *)((long)pdVar34 + lVar31) +
                                       *(double *)
                                        ((long)pdVar34 + lVar41 + (long)(int)(~uVar7 + iVar3) * 8))
                                       * 0.5 * 3.0 +
                                      (*(double *)((long)pdVar34 + lVar24) +
                                      *(double *)((long)pdVar34 + lVar36 * 8 + lVar41)) * -0.5) *
                                      0.5 * dVar53 * dVar1;
                    *pdVar33 = *pdVar33 + dVar54;
                    pdVar34 = pdVar34 + -(lVar15 * lVar18);
                    pdVar33 = pdVar33 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar39);
                }
                lVar26 = lVar26 + 1;
                iVar28 = iVar28 + 1;
                lVar24 = lVar24 + lVar18 * 8;
                lVar31 = lVar31 + lVar18 * 8;
                pdVar27 = pdVar27 + lVar43;
              } while (iVar23 + 1 != (int)lVar26);
            }
            if (bVar19 && ((bVar45 || bVar48) || bVar50)) {
              if (bVar45 && bVar19) {
                if (iVar5 < iVar6) {
                  pdVar33 = (double *)
                            (((long)(int)(~uVar8 + iVar4) * 8 +
                             ((lVar40 + -1) - lVar32) * lVar15 * 8) * lVar18 + (long)pdVar17);
                  pdVar27 = pdVar21 + ((lVar40 + -1) - lVar12) * lVar25 * lVar43;
                  dVar54 = 0.0;
                  lVar24 = lVar40;
                  do {
                    lVar24 = lVar24 + -1;
                    dVar54 = dVar54 + (pdVar33[(int)(~uVar7 + iVar3)] * 3.0 -
                                      pdVar33[(int)((iVar3 - uVar7) + -2)]) * 0.5 * dVar53 * dVar1;
                    *pdVar27 = *pdVar27 + dVar54;
                    pdVar33 = pdVar33 + -(lVar15 * lVar18);
                    pdVar27 = pdVar27 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar24);
                }
              }
              else if (bVar48 && bVar19) {
                if (iVar5 < iVar6) {
                  lVar36 = (long)(int)((iVar3 - uVar7) + -2);
                  lVar24 = ((lVar40 + -1) - lVar32) * lVar15;
                  lVar22 = ((long)iVar13 * 8 + lVar24 * 8 + lVar38 * -8) * lVar18;
                  lVar31 = (lVar35 * 8 + lVar24 * 8 + lVar38 * -8) * lVar18;
                  pdVar33 = pdVar21 + ((lVar40 + -1) - lVar12) * lVar25 * lVar43;
                  dVar54 = 0.0;
                  pdVar27 = pdVar17;
                  lVar24 = lVar40;
                  do {
                    lVar24 = lVar24 + -1;
                    dVar54 = dVar54 + ((*(double *)
                                         ((long)pdVar27 + lVar31 + (long)(int)(~uVar7 + iVar3) * 8)
                                        * 3.0 - *(double *)
                                                 ((long)pdVar27 +
                                                 lVar22 + (long)(int)(~uVar7 + iVar3) * 8)) * 0.5 *
                                       3.0 + (*(double *)((long)pdVar27 + lVar31 + lVar36 * 8) * 3.0
                                             - *(double *)((long)pdVar27 + lVar22 + lVar36 * 8)) *
                                             -0.5) * 0.5 * dVar53 * dVar1;
                    *pdVar33 = *pdVar33 + dVar54;
                    pdVar27 = pdVar27 + -(lVar15 * lVar18);
                    pdVar33 = pdVar33 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar24);
                }
              }
              else if ((bVar50 && bVar19) && iVar5 < iVar6) {
                pdVar33 = (double *)
                          ((lVar35 * 8 + ((lVar40 + -1) - lVar32) * lVar15 * 8 + lVar38 * -8) *
                           lVar18 + (long)pdVar17);
                pdVar27 = pdVar21 + ((lVar40 + -1) - lVar12) * lVar25 * lVar43;
                dVar54 = 0.0;
                lVar24 = lVar40;
                do {
                  lVar24 = lVar24 + -1;
                  dVar54 = dVar54 + (pdVar33[(int)(~uVar7 + iVar3)] * 3.0 -
                                    pdVar33[(int)((iVar3 - uVar7) + -2)]) * 0.5 * dVar53 * dVar1;
                  *pdVar27 = *pdVar27 + dVar54;
                  pdVar33 = pdVar33 + -(lVar15 * lVar18);
                  pdVar27 = pdVar27 + -(lVar25 * lVar43);
                } while (lVar12 < lVar24);
              }
            }
            if (bVar46 && ((bVar47 || bVar49) || bVar51)) {
              if (bVar47 && bVar46) {
                if (iVar5 < iVar6) {
                  pdVar17 = (double *)
                            ((long)pdVar17 +
                            (lVar37 * 8 + ((lVar40 + -1) - lVar32) * lVar15 * 8 + lVar38 * -8) *
                            lVar18);
                  pdVar21 = (double *)
                            ((long)pdVar21 +
                            (lVar37 * 8 + ((lVar40 + -1) - lVar12) * lVar25 * 8 + lVar35 * -8) *
                            lVar43);
                  dVar54 = 0.0;
                  do {
                    lVar40 = lVar40 + -1;
                    dVar54 = dVar54 + (pdVar17[(int)(~uVar7 + iVar3)] * 3.0 -
                                      pdVar17[(int)((iVar3 - uVar7) + -2)]) * 0.5 * dVar53 * dVar1;
                    *pdVar21 = *pdVar21 + dVar54;
                    pdVar17 = pdVar17 + -(lVar15 * lVar18);
                    pdVar21 = pdVar21 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar40);
                }
              }
              else if (bVar49 && bVar46) {
                if (iVar5 < iVar6) {
                  lVar24 = ((lVar40 + -1) - lVar32) * lVar15;
                  lVar31 = (long)(int)((iVar3 - uVar7) + -2);
                  lVar32 = ((long)(int)((iVar30 - uVar8) + -2) * 8 + lVar24 * 8) * lVar18;
                  lVar24 = ((long)iVar14 * 8 + lVar24 * 8 + lVar38 * -8) * lVar18;
                  pdVar21 = (double *)
                            ((long)pdVar21 +
                            (lVar37 * 8 + ((lVar40 + -1) - lVar12) * lVar25 * 8 + lVar35 * -8) *
                            lVar43);
                  dVar54 = 0.0;
                  do {
                    lVar40 = lVar40 + -1;
                    dVar54 = dVar54 + ((*(double *)
                                         ((long)pdVar17 + lVar24 + (long)(int)(~uVar7 + iVar3) * 8)
                                        * 3.0 - *(double *)
                                                 ((long)pdVar17 +
                                                 lVar32 + (long)(int)(~uVar7 + iVar3) * 8)) * 0.5 *
                                       3.0 + (*(double *)((long)pdVar17 + lVar24 + lVar31 * 8) * 3.0
                                             - *(double *)((long)pdVar17 + lVar32 + lVar31 * 8)) *
                                             -0.5) * 0.5 * dVar53 * dVar1;
                    *pdVar21 = *pdVar21 + dVar54;
                    pdVar17 = pdVar17 + -(lVar15 * lVar18);
                    pdVar21 = pdVar21 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar40);
                }
              }
              else if ((bVar51 && bVar46) && iVar5 < iVar6) {
                pdVar17 = (double *)
                          ((long)pdVar17 +
                          ((long)iVar14 * 8 + ((lVar40 + -1) - lVar32) * lVar15 * 8 + lVar38 * -8) *
                          lVar18);
                pdVar21 = (double *)
                          ((long)pdVar21 +
                          (lVar37 * 8 + ((lVar40 + -1) - lVar12) * lVar25 * 8 + lVar35 * -8) *
                          lVar43);
                dVar54 = 0.0;
                do {
                  lVar40 = lVar40 + -1;
                  dVar54 = dVar54 + (pdVar17[(int)(~uVar7 + iVar3)] * 3.0 -
                                    pdVar17[(int)((iVar3 - uVar7) + -2)]) * 0.5 * dVar53 * dVar1;
                  *pdVar21 = *pdVar21 + dVar54;
                  pdVar17 = pdVar17 + -(lVar15 * lVar18);
                  pdVar21 = pdVar21 + -(lVar25 * lVar43);
                } while (lVar12 < lVar40);
              }
            }
          }
        }
        else {
          bVar45 = iVar3 == iVar23;
          bVar46 = local_60[3] == 3;
          bVar47 = iVar9 + 1 == iVar28;
          bVar48 = local_60[0] == 3;
          bVar49 = local_60[3] == 4;
          bVar50 = local_60[0] == 4;
          bVar51 = local_60[3] == 2;
          bVar52 = local_60[0] == 2;
          bVar19 = bVar45 && ((bVar46 || bVar49) || bVar51);
          iVar13 = iVar3 + 1;
          iVar30 = iVar3;
          if (bVar45 && ((bVar46 || bVar49) || bVar51)) {
            iVar30 = iVar13;
          }
          bVar20 = bVar47 && ((bVar48 || bVar50) || bVar52);
          iVar14 = iVar28 + -1;
          iVar23 = iVar28;
          if (bVar47 && ((bVar48 || bVar50) || bVar52)) {
            iVar23 = iVar14;
          }
          if (iVar2 + 2U < 5) {
            if (iVar30 <= iVar23) {
              lVar22 = (long)iVar30;
              lVar26 = ((lVar40 + -1) - lVar32) * lVar15;
              lVar37 = ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar26 * 8) * lVar18;
              iVar30 = ~uVar7 + iVar30;
              lVar26 = (lVar35 * 8 + lVar26 * 8 + lVar38 * -8) * lVar18;
              lVar39 = lVar37 + lVar22 * 8 + lVar36 * -8 + (long)pdVar17;
              lVar41 = lVar26 + lVar22 * 8 + lVar36 * -8 + (long)pdVar17;
              pdVar27 = pdVar21 + ((((lVar40 + -1) - lVar12) * lVar25 * lVar43 + lVar22) - lVar31);
              do {
                if (iVar5 < iVar6) {
                  dVar54 = 0.0;
                  lVar29 = 0;
                  lVar16 = lVar40;
                  pdVar33 = pdVar27;
                  do {
                    lVar16 = lVar16 + -1;
                    dVar54 = dVar54 + ((*(double *)(lVar41 + lVar29) +
                                       *(double *)
                                        ((long)pdVar17 + lVar29 + (long)iVar30 * 8 + lVar26)) * 0.5
                                       * 3.0 + (*(double *)(lVar39 + lVar29) +
                                               *(double *)
                                                ((long)pdVar17 + lVar29 + (long)iVar30 * 8 + lVar37)
                                               ) * -0.5) * 0.5 * dVar53 * dVar1;
                    *pdVar33 = *pdVar33 + dVar54;
                    lVar29 = lVar29 + lVar15 * lVar18 * -8;
                    pdVar33 = pdVar33 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar16);
                }
                lVar22 = lVar22 + 1;
                iVar30 = iVar30 + 1;
                lVar39 = lVar39 + 8;
                lVar41 = lVar41 + 8;
                pdVar27 = pdVar27 + 1;
              } while (iVar23 + 1 != (int)lVar22);
            }
            if (bVar19) {
              if (bVar46 && bVar45) {
                if (iVar5 < iVar6) {
                  lVar22 = ((lVar40 + -1) - lVar32) * lVar15;
                  pdVar27 = pdVar17 + (int)(~uVar7 + iVar3);
                  pdVar33 = pdVar21 + ((lVar40 + -1) - lVar12) * lVar25 * lVar43;
                  dVar54 = 0.0;
                  lVar37 = lVar40;
                  do {
                    lVar37 = lVar37 + -1;
                    dVar54 = dVar54 + (*(double *)
                                        ((long)pdVar27 +
                                        (lVar35 * 8 + lVar22 * 8 + lVar38 * -8) * lVar18) * 3.0 -
                                      *(double *)
                                       ((long)pdVar27 +
                                       ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar22 * 8) * lVar18)
                                      ) * 0.5 * dVar53 * dVar1;
                    *pdVar33 = *pdVar33 + dVar54;
                    pdVar27 = pdVar27 + -(lVar15 * lVar18);
                    pdVar33 = pdVar33 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar37);
                }
              }
              else if (bVar49 && bVar45) {
                if (iVar5 < iVar6) {
                  lVar26 = lVar36 * -8;
                  lVar22 = ((lVar40 + -1) - lVar32) * lVar15;
                  lVar37 = ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar22 * 8) * lVar18;
                  lVar39 = lVar37 + (long)iVar13 * 8 + (long)pdVar17;
                  lVar41 = lVar15 * lVar18 * -8;
                  lVar16 = lVar37 + lVar31 * 8 + (long)pdVar17;
                  lVar37 = (lVar35 * 8 + lVar22 * 8 + lVar38 * -8) * lVar18;
                  lVar29 = lVar37 + (long)iVar13 * 8 + (long)pdVar17;
                  lVar22 = lVar37 + lVar31 * 8 + (long)pdVar17;
                  pdVar27 = pdVar21 + ((lVar40 + -1) - lVar12) * lVar25 * lVar43;
                  dVar54 = 0.0;
                  lVar37 = lVar40;
                  do {
                    lVar37 = lVar37 + -1;
                    dVar54 = dVar54 + ((*(double *)(lVar22 + lVar26) * 3.0 -
                                       *(double *)(lVar29 + lVar26)) * 0.5 * 3.0 +
                                      (*(double *)(lVar16 + lVar26) * 3.0 -
                                      *(double *)(lVar39 + lVar26)) * -0.5) * 0.5 * dVar53 * dVar1;
                    *pdVar27 = *pdVar27 + dVar54;
                    lVar39 = lVar39 + lVar41;
                    lVar16 = lVar16 + lVar41;
                    lVar29 = lVar29 + lVar41;
                    lVar22 = lVar22 + lVar41;
                    pdVar27 = pdVar27 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar37);
                }
              }
              else if ((bVar51 && bVar45) && iVar5 < iVar6) {
                lVar22 = ((lVar40 + -1) - lVar32) * lVar15;
                pdVar33 = pdVar17 + (lVar31 - lVar36);
                pdVar27 = pdVar21 + ((lVar40 + -1) - lVar12) * lVar25 * lVar43;
                dVar54 = 0.0;
                lVar37 = lVar40;
                do {
                  lVar37 = lVar37 + -1;
                  dVar54 = dVar54 + (*(double *)
                                      ((long)pdVar33 +
                                      (lVar35 * 8 + lVar22 * 8 + lVar38 * -8) * lVar18) * 3.0 -
                                    *(double *)
                                     ((long)pdVar33 +
                                     ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar22 * 8) * lVar18))
                                    * 0.5 * dVar53 * dVar1;
                  *pdVar27 = *pdVar27 + dVar54;
                  pdVar33 = pdVar33 + -(lVar15 * lVar18);
                  pdVar27 = pdVar27 + -(lVar25 * lVar43);
                } while (lVar12 < lVar37);
              }
            }
            if (bVar20) {
              if (bVar48 && bVar47) {
                if (iVar5 < iVar6) {
                  pdVar17 = pdVar17 + (lVar24 - lVar36);
                  lVar32 = ((lVar40 + -1) - lVar32) * lVar15;
                  pdVar21 = pdVar21 + ((((lVar40 + -1) - lVar12) * lVar25 * lVar43 + lVar24) -
                                      lVar31);
                  dVar54 = 0.0;
                  do {
                    lVar40 = lVar40 + -1;
                    dVar54 = dVar54 + (*(double *)
                                        ((long)pdVar17 +
                                        (lVar35 * 8 + lVar32 * 8 + lVar38 * -8) * lVar18) * 3.0 -
                                      *(double *)
                                       ((long)pdVar17 +
                                       ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar32 * 8) * lVar18)
                                      ) * 0.5 * dVar53 * dVar1;
                    *pdVar21 = *pdVar21 + dVar54;
                    pdVar17 = pdVar17 + -(lVar15 * lVar18);
                    pdVar21 = pdVar21 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar40);
                }
              }
              else if (bVar50 && bVar47) {
                if (iVar5 < iVar6) {
                  lVar32 = ((lVar40 + -1) - lVar32) * lVar15;
                  lVar22 = (long)(int)((iVar28 - uVar7) + -2);
                  lVar37 = ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar32 * 8) * lVar18;
                  lVar32 = (lVar35 * 8 + lVar32 * 8 + lVar38 * -8) * lVar18;
                  pdVar21 = pdVar21 + ((((lVar40 + -1) - lVar12) * lVar25 * lVar43 + lVar24) -
                                      lVar31);
                  dVar54 = 0.0;
                  do {
                    lVar40 = lVar40 + -1;
                    dVar54 = dVar54 + ((*(double *)
                                         ((long)pdVar17 + lVar32 + (long)iVar14 * 8 + lVar36 * -8) *
                                        3.0 - *(double *)((long)pdVar17 + lVar32 + lVar22 * 8)) *
                                       0.5 * 3.0 +
                                      (*(double *)
                                        ((long)pdVar17 + lVar37 + (long)iVar14 * 8 + lVar36 * -8) *
                                       3.0 - *(double *)((long)pdVar17 + lVar37 + lVar22 * 8)) *
                                      -0.5) * 0.5 * dVar53 * dVar1;
                    *pdVar21 = *pdVar21 + dVar54;
                    pdVar17 = pdVar17 + -(lVar15 * lVar18);
                    pdVar21 = pdVar21 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar40);
                }
              }
              else if ((bVar52 && bVar47) && iVar5 < iVar6) {
                pdVar17 = pdVar17 + (iVar14 - lVar36);
                lVar32 = ((lVar40 + -1) - lVar32) * lVar15;
                pdVar21 = pdVar21 + ((((lVar40 + -1) - lVar12) * lVar25 * lVar43 + lVar24) - lVar31)
                ;
                dVar54 = 0.0;
                do {
                  lVar40 = lVar40 + -1;
                  dVar54 = dVar54 + (*(double *)
                                      ((long)pdVar17 +
                                      (lVar35 * 8 + lVar32 * 8 + lVar38 * -8) * lVar18) * 3.0 -
                                    *(double *)
                                     ((long)pdVar17 +
                                     ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar32 * 8) * lVar18))
                                    * 0.5 * dVar53 * dVar1;
                  *pdVar21 = *pdVar21 + dVar54;
                  pdVar17 = pdVar17 + -(lVar15 * lVar18);
                  pdVar21 = pdVar21 + -(lVar25 * lVar43);
                } while (lVar12 < lVar40);
              }
            }
          }
          else {
            if (iVar30 <= iVar23) {
              lVar37 = (long)iVar30;
              lVar38 = ((lVar40 + -1) - lVar32) * lVar15;
              iVar30 = ~uVar7 + iVar30;
              lVar35 = ((long)(int)(~uVar8 + iVar4) * 8 + lVar38 * 8) * lVar18;
              lVar22 = lVar35 + lVar37 * 8 + lVar36 * -8 + (long)pdVar17;
              pdVar27 = pdVar21 + ((((lVar40 + -1) - lVar12) * lVar25 * lVar43 + lVar37) - lVar31);
              do {
                if (iVar5 < iVar6) {
                  dVar54 = 0.0;
                  lVar39 = 0;
                  lVar26 = lVar40;
                  pdVar33 = pdVar27;
                  do {
                    lVar26 = lVar26 + -1;
                    dVar54 = dVar54 + ((*(double *)
                                         ((long)pdVar17 + lVar39 + (long)iVar30 * 8 + lVar35) +
                                       *(double *)(lVar22 + lVar39)) * 0.5 * 3.0 +
                                      (*(double *)(lVar22 + lVar39) +
                                      *(double *)
                                       ((long)pdVar17 +
                                       lVar39 + (long)iVar30 * 8 +
                                                ((long)(int)((iVar4 - uVar8) + -2) * 8 + lVar38 * 8)
                                                * lVar18)) * -0.5) * 0.5 * dVar53 * dVar1;
                    *pdVar33 = *pdVar33 + dVar54;
                    lVar39 = lVar39 + lVar15 * lVar18 * -8;
                    pdVar33 = pdVar33 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar26);
                }
                lVar37 = lVar37 + 1;
                iVar30 = iVar30 + 1;
                lVar22 = lVar22 + 8;
                pdVar27 = pdVar27 + 1;
              } while (iVar23 + 1 != (int)lVar37);
            }
            if (bVar19) {
              if (bVar46 && bVar45) {
                if (iVar5 < iVar6) {
                  pdVar33 = (double *)
                            (((long)(int)(~uVar8 + iVar4) * 8 +
                             ((lVar40 + -1) - lVar32) * lVar15 * 8) * lVar18 + (long)pdVar17);
                  pdVar27 = pdVar21 + ((lVar40 + -1) - lVar12) * lVar25 * lVar43;
                  dVar54 = 0.0;
                  lVar35 = lVar40;
                  do {
                    lVar35 = lVar35 + -1;
                    dVar54 = dVar54 + (pdVar33[(int)(~uVar7 + iVar3)] * 3.0 -
                                      pdVar33[(int)((iVar3 - uVar7) + -2)]) * 0.5 * dVar53 * dVar1;
                    *pdVar27 = *pdVar27 + dVar54;
                    pdVar33 = pdVar33 + -(lVar15 * lVar18);
                    pdVar27 = pdVar27 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar35);
                }
              }
              else if (bVar49 && bVar45) {
                if (iVar5 < iVar6) {
                  lVar38 = lVar36 * -8;
                  lVar37 = ((lVar40 + -1) - lVar32) * lVar15;
                  lVar35 = ((long)(int)((iVar4 - uVar8) + -2) * 8 + lVar37 * 8) * lVar18;
                  lVar22 = lVar35 + (long)iVar13 * 8 + (long)pdVar17;
                  lVar26 = lVar15 * lVar18 * -8;
                  lVar39 = lVar35 + lVar31 * 8 + (long)pdVar17;
                  lVar35 = ((long)(int)(~uVar8 + iVar4) * 8 + lVar37 * 8) * lVar18;
                  lVar41 = lVar35 + (long)iVar13 * 8 + (long)pdVar17;
                  lVar37 = lVar35 + lVar31 * 8 + (long)pdVar17;
                  pdVar27 = pdVar21 + ((lVar40 + -1) - lVar12) * lVar25 * lVar43;
                  dVar54 = 0.0;
                  lVar35 = lVar40;
                  do {
                    lVar35 = lVar35 + -1;
                    dVar54 = dVar54 + ((*(double *)(lVar37 + lVar38) * 3.0 -
                                       *(double *)(lVar41 + lVar38)) * 0.5 * 3.0 +
                                      (*(double *)(lVar39 + lVar38) * 3.0 -
                                      *(double *)(lVar22 + lVar38)) * -0.5) * 0.5 * dVar53 * dVar1;
                    *pdVar27 = *pdVar27 + dVar54;
                    lVar22 = lVar22 + lVar26;
                    lVar39 = lVar39 + lVar26;
                    lVar41 = lVar41 + lVar26;
                    lVar37 = lVar37 + lVar26;
                    pdVar27 = pdVar27 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar35);
                }
              }
              else if ((bVar51 && bVar45) && iVar5 < iVar6) {
                lVar37 = ((lVar40 + -1) - lVar32) * lVar15;
                pdVar33 = pdVar17 + (lVar31 - lVar36);
                pdVar27 = pdVar21 + ((lVar40 + -1) - lVar12) * lVar25 * lVar43;
                dVar54 = 0.0;
                lVar35 = lVar40;
                do {
                  lVar35 = lVar35 + -1;
                  dVar54 = dVar54 + (*(double *)
                                      ((long)pdVar33 +
                                      ((long)(int)(~uVar8 + iVar4) * 8 + lVar37 * 8) * lVar18) * 3.0
                                    - *(double *)
                                       ((long)pdVar33 +
                                       ((long)(int)((iVar4 - uVar8) + -2) * 8 + lVar37 * 8) * lVar18
                                       )) * 0.5 * dVar53 * dVar1;
                  *pdVar27 = *pdVar27 + dVar54;
                  pdVar33 = pdVar33 + -(lVar15 * lVar18);
                  pdVar27 = pdVar27 + -(lVar25 * lVar43);
                } while (lVar12 < lVar35);
              }
            }
            if (bVar20) {
              if (bVar48 && bVar47) {
                if (iVar5 < iVar6) {
                  pdVar17 = pdVar17 + (lVar24 - lVar36);
                  lVar32 = ((lVar40 + -1) - lVar32) * lVar15;
                  pdVar21 = pdVar21 + ((((lVar40 + -1) - lVar12) * lVar25 * lVar43 + lVar24) -
                                      lVar31);
                  dVar54 = 0.0;
                  do {
                    lVar40 = lVar40 + -1;
                    dVar54 = dVar54 + (*(double *)
                                        ((long)pdVar17 +
                                        ((long)(int)(~uVar8 + iVar4) * 8 + lVar32 * 8) * lVar18) *
                                       3.0 - *(double *)
                                              ((long)pdVar17 +
                                              ((long)(int)((iVar4 - uVar8) + -2) * 8 + lVar32 * 8) *
                                              lVar18)) * 0.5 * dVar53 * dVar1;
                    *pdVar21 = *pdVar21 + dVar54;
                    pdVar17 = pdVar17 + -(lVar15 * lVar18);
                    pdVar21 = pdVar21 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar40);
                }
              }
              else if (bVar50 && bVar47) {
                if (iVar5 < iVar6) {
                  lVar32 = ((lVar40 + -1) - lVar32) * lVar15;
                  lVar35 = (long)(int)((iVar28 - uVar7) + -2);
                  lVar37 = ((long)(int)((iVar4 - uVar8) + -2) * 8 + lVar32 * 8) * lVar18;
                  lVar32 = ((long)(int)(~uVar8 + iVar4) * 8 + lVar32 * 8) * lVar18;
                  pdVar21 = pdVar21 + ((((lVar40 + -1) - lVar12) * lVar25 * lVar43 + lVar24) -
                                      lVar31);
                  dVar54 = 0.0;
                  do {
                    lVar40 = lVar40 + -1;
                    dVar54 = dVar54 + ((*(double *)
                                         ((long)pdVar17 + lVar32 + (long)iVar14 * 8 + lVar36 * -8) *
                                        3.0 - *(double *)((long)pdVar17 + lVar32 + lVar35 * 8)) *
                                       0.5 * 3.0 +
                                      (*(double *)
                                        ((long)pdVar17 + lVar37 + (long)iVar14 * 8 + lVar36 * -8) *
                                       3.0 - *(double *)((long)pdVar17 + lVar37 + lVar35 * 8)) *
                                      -0.5) * 0.5 * dVar53 * dVar1;
                    *pdVar21 = *pdVar21 + dVar54;
                    pdVar17 = pdVar17 + -(lVar15 * lVar18);
                    pdVar21 = pdVar21 + -(lVar25 * lVar43);
                  } while (lVar12 < lVar40);
                }
              }
              else if ((bVar52 && bVar47) && iVar5 < iVar6) {
                pdVar17 = pdVar17 + (iVar14 - lVar36);
                lVar32 = ((lVar40 + -1) - lVar32) * lVar15;
                pdVar21 = pdVar21 + ((((lVar40 + -1) - lVar12) * lVar25 * lVar43 + lVar24) - lVar31)
                ;
                dVar54 = 0.0;
                do {
                  lVar40 = lVar40 + -1;
                  dVar54 = dVar54 + (*(double *)
                                      ((long)pdVar17 +
                                      ((long)(int)(~uVar8 + iVar4) * 8 + lVar32 * 8) * lVar18) * 3.0
                                    - *(double *)
                                       ((long)pdVar17 +
                                       ((long)(int)((iVar4 - uVar8) + -2) * 8 + lVar32 * 8) * lVar18
                                       )) * 0.5 * dVar53 * dVar1;
                  *pdVar21 = *pdVar21 + dVar54;
                  pdVar17 = pdVar17 + -(lVar15 * lVar18);
                  pdVar21 = pdVar21 + -(lVar25 * lVar43);
                } while (lVar12 < lVar40);
              }
            }
          }
        }
      }
      uVar44 = uVar44 + 1;
    } while (uVar44 != (uint)numOutFlowFaces);
  }
  return;
}

Assistant:

void
Projection::computeRhoG(FArrayBox*         rhoFab,
			FArrayBox*         phiFab,
			const Geometry&    geom,
			Orientation*       outFaces,
			int                numOutFlowFaces,
			Real               gravity)
{
    AMREX_ASSERT(std::fabs(gravity) > 0.);

    for (int iface = 0; iface < numOutFlowFaces; iface++)
    {
      int outDir             = outFaces[iface].coordDir();
      Orientation::Side side = outFaces[iface].faceDir();

      if (outDir == (AMREX_SPACEDIM-1))
      {
	  if (side == Orientation::high) {
	    //
	    // Hydrostatic pressure == 0 here, given IAMR definition of gravity.
	    // Do nothing, since phi already initialized to zero
	    //
	  } else {
	    amrex::Abort("Projection::computeRhoG : Simulation box has outflow boundary condition on the bottom and gravity != 0. If this is really the desired configuration, just comment out this Abort");
	  }
      }
      else // integrate rho * g* dh
      {
	  const auto   lo = amrex::lbound(phiFab[iface].box());
	  const auto   hi = amrex::ubound(phiFab[iface].box());
	  const auto& phi = phiFab[iface].array();
	  const auto& rho = rhoFab[iface].array();
	  const Real dh = geom.CellSize(AMREX_SPACEDIM-1);

	  auto add_rhog = [gravity, dh] ( Real rho1, Real rho2,
					  Real& rhog_i, Real& phi_i )
	  {
	    Real rhoExt = 0.5*(3.*rho1-rho2);
	    rhog_i -= gravity * rhoExt * dh;
	    phi_i  += rhog_i;
	  };


#if (AMREX_SPACEDIM == 2)
	  //
	  // Only possibilities are XLO face or XHI
	  //
	  // Ok to only use low index of phi because phi is only one
	  // node wide in i-direction.
	  //
	  AMREX_ASSERT( lo.x==hi.x );
	  int i = lo.x;

	  Real rhog = 0.;
	  //
	  // Note that the integral here prevents parallelization
	  //
	  if (side == Orientation::low)
	  {
	    for (int j = hi.y-1; j >= lo.y; j--) {
	      add_rhog(rho(i,j,0),rho(i+1,j,0),rhog,phi(i,j,0));
	    }
	  }
	  else
	  {
	    for (int j = hi.y-1; j >= lo.y; j--) {
	      add_rhog(rho(i-1,j,0),rho(i-2,j,0),rhog,phi(i,j,0));
	    }
	  }
#else
	  const Box& domain = geom.Domain();
	  const auto domlo = amrex::lbound(domain);
	  const auto domhi = amrex::ubound(domain);

	  // fixme? Could make use of NSB::m_bcrec_scalars here.
	  int        lo_bc[AMREX_SPACEDIM];
	  int        hi_bc[AMREX_SPACEDIM];
	  //
	  // change from phys_bcs of Inflow, SlipWall, etc.
	  // to mathematical bcs of EXT_DIR, FOEXTRAP, etc.
	  //
	  for (int i = 0; i < AMREX_SPACEDIM; i++)
	  {
	      const int* lbc = phys_bc->lo();
	      const int* hbc = phys_bc->hi();

	      lo_bc[i]=scalar_bc[lbc[i]];
	      hi_bc[i]=scalar_bc[hbc[i]];
	  }

	  //
	  // fixme? - TODO: Could parallelize here by dividing the loop over i (or j)
	  // only and thus the k integration stays intact. However, would want to move
	  // this declaration of rho_i, rho_ii to ensure each k integration has it's own
	  // copy.
	  //
	  Real rho_i, rho_ii;

	  if ( outDir == int(Direction::x) )
	  {
	      //
	      // Ok to only use low index of phi because phi is only one
	      // node wide in i-direction.
	      //
	      AMREX_ASSERT( lo.x==hi.x );
	      int i = lo.x;

	      bool has_extdir_lo = (lo.y==domlo.y   && lo_bc[1]==BCType::ext_dir);
	      bool has_extdir_hi = (hi.y==domhi.y+1 && hi_bc[1]==BCType::ext_dir);
	      bool has_hoextrap_lo = (lo.y==domlo.y   && lo_bc[1]==BCType::hoextrap);
	      bool has_hoextrap_hi = (hi.y==domhi.y+1 && hi_bc[1]==BCType::hoextrap);
	      bool has_foextrap_lo = (lo.y==domlo.y   && lo_bc[1]==BCType::foextrap);
	      bool has_foextrap_hi = (hi.y==domhi.y+1 && hi_bc[1]==BCType::foextrap);

	      //
	      // If there are any of the above mentioned bcs, then we'll need to handle
	      // edges separately in accordance with those conditions, so set bounds for
	      // loop over j accordingly.
	      //
	      int jlo, jhi;
	      if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo ) {
		jlo = lo.y+1;
	      } else {
		jlo = lo.y;
	      }
	      if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi ) {
		jhi = hi.y-1;
	      } else {
		jhi = hi.y;
	      }

	      //
	      // xlo face
	      //
	      if (side == Orientation::low)
	      {
		for (int j = jlo; j <= jhi; j++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i  = 0.5 * (rho(i  ,j,k) + rho(i  ,j-1,k));
		    rho_ii = 0.5 * (rho(i+1,j,k) + rho(i+1,j-1,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute y-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int j = lo.y;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j-1,k);
		      rho_ii = rho(i+1,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = 0.5*(3.*rho(i  ,j,k) - rho(i  ,j+1,k));
		      rho_ii = 0.5*(3.*rho(i+1,j,k) - rho(i+1,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j,k);
		      rho_ii = rho(i+1,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int j = hi.y;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j,k);
		      rho_ii = rho(i+1,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = 0.5*(3.*rho(i  ,j-1,k) - rho(i  ,j-2,k));
		      rho_ii = 0.5*(3.*rho(i+1,j-1,k) - rho(i+1,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j-1,k);
		      rho_ii = rho(i+1,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      }
	      else // xhi face
	      {
		for (int j = jlo; j <= jhi; j++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i   = 0.5 * (rho(i-1,j,k) + rho(i-1,j-1,k));
		    rho_ii = 0.5 * (rho(i-2,j,k) + rho(i-2,j-1,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute y-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int j = lo.y;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-2,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j,k) - rho(i-1,j+1,k));
		      rho_ii = 0.5*(3.*rho(i-2,j,k) - rho(i-2,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j,k);
		      rho_ii = rho(i-2,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int j = hi.y;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j,k);
		      rho_ii = rho(i-2,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j-1,k) - rho(i-1,j-2,k));
		      rho_ii = 0.5*(3.*rho(i-2,j-1,k) - rho(i-2,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-2,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      }
	  }
	  else // ( outDir == Direction::y )
	  {
	      //
	      // Ok to only use low index of phi because phi is only one
	      // node wide in i-direction.
	      //
	      AMREX_ASSERT( lo.y==hi.y );
	      int j = lo.y;

	      bool has_extdir_lo = (lo.x==domlo.x   && lo_bc[0]==BCType::ext_dir);
	      bool has_extdir_hi = (hi.x==domhi.x+1 && hi_bc[0]==BCType::ext_dir);
	      bool has_hoextrap_lo = (lo.x==domlo.x   && lo_bc[0]==BCType::hoextrap);
	      bool has_hoextrap_hi = (hi.x==domhi.x+1 && hi_bc[0]==BCType::hoextrap);
	      bool has_foextrap_lo = (lo.x==domlo.x   && lo_bc[0]==BCType::foextrap);
	      bool has_foextrap_hi = (hi.x==domhi.x+1 && hi_bc[0]==BCType::foextrap);
	      //
	      // If there are any of the above mentioned bcs, then we'll need to handle
	      // edges separately in accordance with those conditions, so set bounds for
	      // loop over i accordingly.
	      //
	      int ilo, ihi;
	      if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo ) {
		ilo = lo.x+1;
	      } else {
		ilo = lo.x;
	      }
	      if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi ) {
		ihi = hi.x-1;
	      } else {
		ihi = hi.x;
	      }
	      //
	      // ylo face
	      //
	      if (side == Orientation::low)
	      {
		for (int i = ilo; i <= ihi; i++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i   = 0.5 * (rho(i,j  ,k) + rho(i-1,j ,k));
		    rho_ii = 0.5 * (rho(i,j+1,k) + rho(i-1,j+1,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute x-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int i = lo.x;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j  ,k);
		      rho_ii = rho(i-1,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i,j  ,k) - rho(i+1,j  ,k));
		      rho_ii = 0.5*(3.*rho(i,j+1,k) - rho(i+1,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j  ,k);
		      rho_ii = rho(i,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int i = hi.x;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j  ,k);
		      rho_ii = rho(i,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j  ,k) - rho(i-2,j  ,k));
		      rho_ii = 0.5*(3.*rho(i-1,j+1,k) - rho(i-2,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j  ,k);
		      rho_ii = rho(i-1,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      }
	      else // yhi face
	      {
		for (int i = ilo; i <= ihi; i++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i   = 0.5 * (rho(i,j-1,k) + rho(i-1,j-1,k));
		    rho_ii = 0.5 * (rho(i,j-1,k) + rho(i-1,j-2,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute y-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int i = lo.x;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-2,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i,j-1,k) - rho(i+1,j-1,k));
		      rho_ii = 0.5*(3.*rho(i,j-2,k) - rho(i+1,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j-1,k);
		      rho_ii = rho(i,j-2,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int i = hi.x;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j-1,k);
		      rho_ii = rho(i,j-2,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j-1,k) - rho(i-2,j-1,k));
		      rho_ii = 0.5*(3.*rho(i-1,j-2,k) - rho(i-2,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-1,j-2,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      } // endif over hi/low sides
	  } // endif over directions
#endif
      } // endif integrate rho*g*dh
    } // end loop over outflow faces
}